

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void BrotliEncoderCleanupState(BrotliEncoderState *s)

{
  MemoryManager *m_00;
  Hasher *pHVar1;
  MemoryManager *m;
  BrotliEncoderState *s_local;
  
  m_00 = &s->memory_manager_;
  BrotliFree(m_00,s->storage_);
  s->storage_ = (uint8_t *)0x0;
  BrotliFree(m_00,s->commands_);
  s->commands_ = (Command *)0x0;
  BrotliFree(m_00,(s->ringbuffer_).data_);
  (s->ringbuffer_).data_ = (uint8_t *)0x0;
  pHVar1 = &s->hasher_;
  if ((pHVar1->common).extra != (void *)0x0) {
    BrotliFree(m_00,(pHVar1->common).extra);
    (pHVar1->common).extra = (void *)0x0;
  }
  BrotliFree(m_00,s->large_table_);
  s->large_table_ = (int *)0x0;
  BrotliFree(m_00,s->command_buf_);
  s->command_buf_ = (uint32_t *)0x0;
  BrotliFree(m_00,s->literal_buf_);
  s->literal_buf_ = (uint8_t *)0x0;
  return;
}

Assistant:

static void BrotliEncoderCleanupState(BrotliEncoderState* s) {
  MemoryManager* m = &s->memory_manager_;
  if (BROTLI_IS_OOM(m)) {
    BrotliWipeOutMemoryManager(m);
    return;
  }
  BROTLI_FREE(m, s->storage_);
  BROTLI_FREE(m, s->commands_);
  RingBufferFree(m, &s->ringbuffer_);
  DestroyHasher(m, &s->hasher_);
  BROTLI_FREE(m, s->large_table_);
  BROTLI_FREE(m, s->command_buf_);
  BROTLI_FREE(m, s->literal_buf_);
}